

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O1

void OpenSteer::OpenSteerDemo::position2dCamera
               (AbstractVehicle *selected,float distance,float elevation)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float fVar1;
  float fVar2;
  
  fVar1 = elevation;
  selectedVehicle = selected;
  (*(selected->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[6])();
  fVar2 = fVar1;
  (*(selected->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(selected);
  fVar2 = fVar2 - fVar1 * distance;
  camera.super_LocalSpace._position.x = extraout_XMM0_Da_00 - distance * extraout_XMM0_Da;
  camera.super_LocalSpace._position.y = extraout_XMM0_Db_00 - distance * extraout_XMM0_Db;
  camera.super_LocalSpace._position.z = fVar2;
  (*(selected->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(selected);
  camera.target.x = extraout_XMM0_Da_01;
  camera.target.y = extraout_XMM0_Db_01;
  camera.target.z = fVar2;
  camera.super_LocalSpace._position.y = camera.super_LocalSpace._position.y + elevation;
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::position2dCamera (AbstractVehicle& selected,
                                            float distance,
                                            float elevation)
{
    // position the camera as if in 3d:
    position3dCamera (selected, distance, elevation);

    // then adjust for 3d:
    Vec3 position3d = camera.position();
    position3d.y += elevation;
    camera.setPosition (position3d);
}